

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationTanh * __thiscall
CoreML::Specification::ActivationParams::mutable_tanh(ActivationParams *this)

{
  ActivationLinear *this_00;
  
  if (this->_oneof_case_[0] == 0x1e) {
    this_00 = (this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x1e;
    this_00 = (ActivationLinear *)operator_new(0x18);
    ActivationTanh::ActivationTanh((ActivationTanh *)this_00);
    (this->NonlinearityType_).tanh_ = (ActivationTanh *)this_00;
  }
  return (ActivationTanh *)this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationTanh* ActivationParams::mutable_tanh() {
  if (!has_tanh()) {
    clear_NonlinearityType();
    set_has_tanh();
    NonlinearityType_.tanh_ = new ::CoreML::Specification::ActivationTanh;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.tanh)
  return NonlinearityType_.tanh_;
}